

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_view_unittest.cpp
# Opt level: O1

void __thiscall array_view_const_view_Test::TestBody(array_view_const_view_Test *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  void *__ptr;
  char *pcVar4;
  long lVar5;
  void *ptr;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  internal local_48;
  undefined7 uStack_47;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  
  lVar5 = 0x28;
  iVar2 = posix_memalign((void **)&local_48,8,0x28);
  lVar3 = 0;
  __ptr = (void *)0x0;
  if (iVar2 == 0) {
    __ptr = (void *)CONCAT71(uStack_47,local_48);
  }
  do {
    *(int *)((long)__ptr + lVar3 * 4) = (int)lVar3;
    lVar3 = lVar3 + 1;
    lVar5 = lVar5 + -4;
  } while (lVar5 != 0);
  lVar3 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>
              (&local_48,"v[i]","v_const[i]",(int *)((long)__ptr + lVar3),
               (int *)((long)__ptr + lVar3));
    if (local_48 == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar4 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x15,pcVar4);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x28);
  lVar3 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>
              (&local_48,"v[i]","v_const[i]",(int *)((long)__ptr + lVar3),
               (int *)((long)__ptr + lVar3));
    if (local_48 == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar4 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x1b,pcVar4);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x28);
  lVar3 = 0;
  do {
    testing::internal::CmpHelperEQ<int,int>
              (&local_48,"v[i]","v_const[i]",(int *)((long)__ptr + lVar3),
               (int *)((long)__ptr + lVar3));
    if (local_48 == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      pcVar4 = "";
      if (local_40.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar4 = ((local_40.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_view_unittest.cpp"
                 ,0x21,pcVar4);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           (local_50.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_50.ptr_ + 8))();
        }
        local_50.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x28);
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

TEST(array_view, const_view) {
    using vector = memory::HostVector<int>;
    using view   = vector::view_type;
    using const_view  = vector::const_view_type;

    vector v(10);
    std::iota(v.begin(), v.end(), 0);

    view v_non_const = v;

    {
        const_view v_const(v);
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
    {
        const_view v_const(v_non_const);
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
    {
        const_view v_const(v(memory::all));
        for(auto i : v.range()) {
            EXPECT_EQ(v[i], v_const[i]);
        }
    }
}